

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

void Gla_ManCollect(Gla_Man_t *p,Vec_Int_t *vPis,Vec_Int_t *vPPis,Vec_Int_t *vCos,Vec_Int_t *vRoAnds
                   )

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gla_Obj_t *pGVar5;
  Gla_Obj_t *pGVar6;
  Vec_Int_t *p_00;
  ulong uVar7;
  
  pGVar1 = p->pGia;
  pGVar4 = Gia_ManPo(pGVar1,(int)vPis);
  iVar2 = Gia_ObjId(pGVar1,pGVar4);
  Vec_IntPush(vCos,iVar2);
  for (iVar2 = 0; iVar2 < p->vAbs->nSize; iVar2 = iVar2 + 1) {
    iVar3 = Vec_IntEntry(p->vAbs,iVar2);
    pGVar5 = Gla_ManObj(p,iVar3);
    if ((*(uint *)&pGVar5->field_0x4 & 0xa4) == 0) {
      __assert_fail("pObj->fConst || pObj->fRo || pObj->fAnd",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                    ,0xf0,
                    "void Gla_ManCollect(Gla_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    if ((*(uint *)&pGVar5->field_0x4 & 0x20) != 0) {
      pGVar1 = p->pGia;
      pGVar4 = Gia_ManObj(pGVar1,pGVar5->iGiaObj);
      pGVar4 = Gia_ObjRoToRi(pGVar1,pGVar4);
      iVar3 = Gia_ObjId(p->pGia,pGVar4);
      Vec_IntPush(vCos,iVar3);
    }
    for (uVar7 = 0; uVar7 < *(uint *)&pGVar5->field_0x4 >> 9; uVar7 = uVar7 + 1) {
      pGVar6 = Gla_ManObj(p,pGVar5->Fanins[uVar7]);
      if ((*(uint *)&pGVar6->field_0x4 & 1) == 0) {
        p_00 = vPis;
        if ((*(uint *)&pGVar6->field_0x4 & 8) == 0) {
          p_00 = vPPis;
        }
        Vec_IntPush(p_00,pGVar6->iGiaObj);
      }
    }
  }
  Vec_IntUniqify(vPis);
  Vec_IntUniqify(vPPis);
  Vec_IntSort(vCos,0);
  Gia_ManIncrementTravId(p->pGia);
  Gia_ObjSetTravIdCurrent(p->pGia,p->pGia->pObjs);
  for (iVar2 = 0; iVar2 < vPis->nSize; iVar2 = iVar2 + 1) {
    pGVar1 = p->pGia;
    iVar3 = Vec_IntEntry(vPis,iVar2);
    pGVar4 = Gia_ManObj(pGVar1,iVar3);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    Gia_ObjSetTravIdCurrent(p->pGia,pGVar4);
  }
  for (iVar2 = 0; iVar2 < vPPis->nSize; iVar2 = iVar2 + 1) {
    pGVar1 = p->pGia;
    iVar3 = Vec_IntEntry(vPPis,iVar2);
    pGVar4 = Gia_ManObj(pGVar1,iVar3);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    Gia_ObjSetTravIdCurrent(p->pGia,pGVar4);
  }
  for (iVar2 = 0; iVar2 < vCos->nSize; iVar2 = iVar2 + 1) {
    pGVar1 = p->pGia;
    iVar3 = Vec_IntEntry(vCos,iVar2);
    pGVar4 = Gia_ManObj(pGVar1,iVar3);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if (iVar2 != 0) {
      pGVar4 = Gia_ObjRiToRo(p->pGia,pGVar4);
      Gia_ObjSetTravIdCurrent(p->pGia,pGVar4);
      iVar3 = Gia_ObjId(p->pGia,pGVar4);
      Vec_IntPush(vRoAnds,iVar3);
    }
  }
  iVar2 = 0;
  while( true ) {
    if (vCos->nSize <= iVar2) {
      return;
    }
    pGVar1 = p->pGia;
    iVar3 = Vec_IntEntry(vCos,iVar2);
    pGVar4 = Gia_ManObj(pGVar1,iVar3);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    Gla_ManCollectInternal_rec
              (p->pGia,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff),vRoAnds);
    iVar2 = iVar2 + 1;
  }
  return;
}

Assistant:

void Gla_ManCollect( Gla_Man_t * p, Vec_Int_t * vPis, Vec_Int_t * vPPis, Vec_Int_t * vCos, Vec_Int_t * vRoAnds )
{
    Gla_Obj_t * pObj, * pFanin; 
    Gia_Obj_t * pGiaObj;
    int i, k;

    // collect COs
    Vec_IntPush( vCos, Gia_ObjId(p->pGia, Gia_ManPo(p->pGia, 0)) );
    // collect fanins of abstracted objects
    Gla_ManForEachObjAbs( p, pObj, i )
    {
        assert( pObj->fConst || pObj->fRo || pObj->fAnd );
        if ( pObj->fRo )
        {
            pGiaObj = Gia_ObjRoToRi( p->pGia, Gia_ManObj(p->pGia, pObj->iGiaObj) );
            Vec_IntPush( vCos, Gia_ObjId(p->pGia, pGiaObj) );
        }
        Gla_ObjForEachFanin( p, pObj, pFanin, k )
            if ( !pFanin->fAbs )
                Vec_IntPush( (pFanin->fPi ? vPis : vPPis), pFanin->iGiaObj );
    }
    Vec_IntUniqify( vPis );
    Vec_IntUniqify( vPPis );
    Vec_IntSort( vCos, 0 );
    // sorting PIs/PPIs/COs leads to refinements that are more "well-aligned"...

    // mark const/PIs/PPIs
    Gia_ManIncrementTravId( p->pGia );
    Gia_ObjSetTravIdCurrent( p->pGia, Gia_ManConst0(p->pGia) );
    Gia_ManForEachObjVec( vPis, p->pGia, pGiaObj, i )
        Gia_ObjSetTravIdCurrent( p->pGia, pGiaObj );
    Gia_ManForEachObjVec( vPPis, p->pGia, pGiaObj, i )
        Gia_ObjSetTravIdCurrent( p->pGia, pGiaObj );
    // mark and add ROs first
    Gia_ManForEachObjVec( vCos, p->pGia, pGiaObj, i )
    {
        if ( i == 0 ) continue;
        pGiaObj = Gia_ObjRiToRo( p->pGia, pGiaObj );
        Gia_ObjSetTravIdCurrent( p->pGia, pGiaObj );
        Vec_IntPush( vRoAnds, Gia_ObjId(p->pGia, pGiaObj) );
    }
    // collect nodes between PIs/PPIs/ROs and COs
    Gia_ManForEachObjVec( vCos, p->pGia, pGiaObj, i )
        Gla_ManCollectInternal_rec( p->pGia, Gia_ObjFanin0(pGiaObj), vRoAnds );
}